

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

unsigned_short flatbuffers::JsonPrinter::GetFieldDefault<unsigned_short>(FieldDef *fd)

{
  bool bVar1;
  ulong in_RAX;
  unsigned_short val;
  undefined8 uStack_8;
  
  uStack_8 = in_RAX & 0xffffffffffff;
  bVar1 = StringToNumber<unsigned_short>
                    ((fd->value).constant._M_dataplus._M_p,(unsigned_short *)((long)&uStack_8 + 6));
  if (bVar1) {
    return uStack_8._6_2_;
  }
  __assert_fail("check",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_text.cpp"
                ,0xfb,
                "static T flatbuffers::JsonPrinter::GetFieldDefault(const FieldDef &) [T = unsigned short]"
               );
}

Assistant:

static T GetFieldDefault(const FieldDef &fd) {
    T val{};
    auto check = StringToNumber(fd.value.constant.c_str(), &val);
    (void)check;
    FLATBUFFERS_ASSERT(check);
    return val;
  }